

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

void __thiscall QRingBuffer::append(QRingBuffer *this,QByteArray *qba)

{
  bool bVar1;
  qsizetype qVar2;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  rvalue_ref in_stack_ffffffffffffff98;
  QRingChunk *in_stack_ffffffffffffffa0;
  QRingChunk *this_00;
  QRingChunk local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x18) == 0) {
    bVar1 = QList<QRingChunk>::isEmpty((QList<QRingChunk> *)0x62c87b);
    if (!bVar1) {
      QList<QRingChunk>::last((QList<QRingChunk> *)in_stack_ffffffffffffff98);
      QRingChunk::assign(in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->chunk);
      goto LAB_0062c8e7;
    }
  }
  this_00 = &local_30;
  QRingChunk::QRingChunk(this_00,&in_stack_ffffffffffffff98->chunk);
  QList<QRingChunk>::append((QList<QRingChunk> *)this_00,in_stack_ffffffffffffff98);
  QRingChunk::~QRingChunk((QRingChunk *)0x62c8b0);
LAB_0062c8e7:
  qVar2 = QByteArray::size(in_RSI);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + qVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingBuffer::append(const QByteArray &qba)
{
    if (bufferSize != 0 || buffers.isEmpty())
        buffers.append(QRingChunk(qba));
    else
        buffers.last().assign(qba);
    bufferSize += qba.size();
}